

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O3

void aes_psp_decrypt_x86(aes_context *ctx,uint8_t *prev,uint8_t *block,uint8_t *buffer,uint32_t size
                        )

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int nr;
  long lVar9;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint uVar10;
  uint extraout_XMM0_Dd;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  __m128i alVar15;
  
  nr = (int)buffer;
  if (size != 0) {
    uVar6 = *(uint *)block;
    uVar7 = *(uint *)(block + 4);
    uVar8 = *(uint *)(block + 8);
    uVar10 = *(uint *)(block + 0xc);
    lVar9 = 0;
    uVar11 = *(uint *)prev;
    uVar12 = *(uint *)(prev + 4);
    uVar13 = *(uint *)(prev + 8);
    uVar14 = *(uint *)(prev + 0xc);
    do {
      uVar10 = uVar10 + 1;
      alVar15[1]._0_4_ = ctx->nr;
      alVar15[0] = (longlong)ctx->key;
      alVar15[1]._4_4_ = 0;
      alVar15 = aes_decrypt_x86(alVar15,(__m128i *)block,nr);
      block = alVar15[1];
      puVar1 = (uint *)(buffer + lVar9);
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = (uint *)(buffer + lVar9);
      *puVar2 = *puVar1 ^ uVar11 ^ extraout_XMM0_Da;
      puVar2[1] = uVar3 ^ uVar12 ^ extraout_XMM0_Db;
      puVar2[2] = uVar4 ^ uVar13 ^ extraout_XMM0_Dc;
      puVar2[3] = uVar5 ^ uVar14 ^ extraout_XMM0_Dd;
      lVar9 = lVar9 + 0x10;
      uVar11 = uVar6;
      uVar12 = uVar7;
      uVar13 = uVar8;
      uVar14 = uVar10;
    } while ((uint)lVar9 < size);
  }
  return;
}

Assistant:

void aes_psp_decrypt_x86(const aes_context* ctx, const uint8_t* prev, const uint8_t* block, uint8_t* buffer, uint32_t size)
{
  const __m128i* key = (__m128i*)ctx->key;
  __m128i one = _mm_setr_epi32(0, 0, 0, 1);

  __m128i x = _mm_load_si128((__m128i*)prev);
  __m128i y = _mm_load_si128((__m128i*)block);

  __m128i* data = (__m128i*)buffer;

  for (uint32_t i = 0; i < size; i += 16)
  {
    y = _mm_add_epi32(y, one);

    __m128i out = aes_decrypt_x86(y, key, ctx->nr);

    out = _mm_xor_si128(out, _mm_loadu_si128(data));
    out = _mm_xor_si128(out, x);
    _mm_storeu_si128(data++, out);
    x = y;
  }
}